

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

size_type anon_unknown.dwarf_f716::root_directory_start(string_type *path,size_type size)

{
  bool bVar1;
  value_type *pvVar2;
  ulong local_30;
  size_type pos;
  size_type size_local;
  string_type *path_local;
  
  if (size == 2) {
    pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)path);
    bVar1 = is_separator(*pvVar2);
    if (bVar1) {
      pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)path);
      bVar1 = is_separator(*pvVar2);
      if (bVar1) {
        return 0xffffffffffffffff;
      }
    }
  }
  if (3 < size) {
    pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)path);
    bVar1 = is_separator(*pvVar2);
    if (bVar1) {
      pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)path);
      bVar1 = is_separator(*pvVar2);
      if (bVar1) {
        pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)path);
        bVar1 = is_separator(*pvVar2);
        if (!bVar1) {
          local_30 = std::__cxx11::string::find_first_of((char *)path,0x120c02);
          if (size <= local_30) {
            local_30 = 0xffffffffffffffff;
          }
          return local_30;
        }
      }
    }
  }
  if (size != 0) {
    pvVar2 = (value_type *)std::__cxx11::string::operator[]((ulong)path);
    bVar1 = is_separator(*pvVar2);
    if (bVar1) {
      return 0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_type root_directory_start(const string_type & path, size_type size)
  // return npos if no root_directory found
  {

#   ifdef BOOST_WINDOWS_API
    // case "c:/"
    if (size > 2
      && path[1] == colon
      && is_separator(path[2])) return 2;
#   endif

    // case "//"
    if (size == 2
      && is_separator(path[0])
      && is_separator(path[1])) return string_type::npos;

#   ifdef BOOST_WINDOWS_API
    // case "\\?\"
    if (size > 4
      && is_separator(path[0])
      && is_separator(path[1])
      && path[2] == questionmark
      && is_separator(path[3]))
    {
      string_type::size_type pos(path.find_first_of(separators, 4));
        return pos < size ? pos : string_type::npos;
    }
#   endif

    // case "//net {/}"
    if (size > 3
      && is_separator(path[0])
      && is_separator(path[1])
      && !is_separator(path[2]))
    {
      string_type::size_type pos(path.find_first_of(separators, 2));
      return pos < size ? pos : string_type::npos;
    }
    
    // case "/"
    if (size > 0 && is_separator(path[0])) return 0;

    return string_type::npos;
  }